

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

string * getAutogenTargetName_abi_cxx11_(string *__return_storage_ptr__,cmTarget *target)

{
  string *psVar1;
  cmTarget *target_local;
  string *autogenTargetName;
  
  psVar1 = cmTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_automoc");
  return __return_storage_ptr__;
}

Assistant:

static std::string getAutogenTargetName(cmTarget const* target)
{
  std::string autogenTargetName = target->GetName();
  autogenTargetName += "_automoc";
  return autogenTargetName;
}